

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_node.cpp
# Opt level: O0

void tst_node_cast(void)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = tst_node_cast_helper<rengine::OpacityNode>();
  if ((!bVar1) && (bVar1 = tst_node_cast_helper<rengine::OpacityNode>(), !bVar1)) {
    __assert_fail("tst_node_cast_helper<OpacityNode>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                  ,0x26,"void tst_node_cast()");
  }
  bVar1 = tst_node_cast_helper<rengine::TextureNode>();
  if ((!bVar1) && (bVar1 = tst_node_cast_helper<rengine::TextureNode>(), !bVar1)) {
    __assert_fail("tst_node_cast_helper<TextureNode>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                  ,0x27,"void tst_node_cast()");
  }
  bVar1 = tst_node_cast_helper<rengine::TransformNode>();
  if ((!bVar1) && (bVar1 = tst_node_cast_helper<rengine::TransformNode>(), !bVar1)) {
    __assert_fail("tst_node_cast_helper<TransformNode>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                  ,0x28,"void tst_node_cast()");
  }
  bVar1 = tst_node_cast_helper<rengine::RectangleNode>();
  if ((!bVar1) && (bVar1 = tst_node_cast_helper<rengine::RectangleNode>(), !bVar1)) {
    __assert_fail("tst_node_cast_helper<RectangleNode>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                  ,0x29,"void tst_node_cast()");
  }
  bVar1 = tst_node_cast_helper<rengine::ColorFilterNode>();
  if ((!bVar1) && (bVar1 = tst_node_cast_helper<rengine::ColorFilterNode>(), !bVar1)) {
    __assert_fail("tst_node_cast_helper<ColorFilterNode>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                  ,0x2a,"void tst_node_cast()");
  }
  bVar1 = tst_node_cast_helper<rengine::BlurNode>();
  if ((!bVar1) && (bVar1 = tst_node_cast_helper<rengine::BlurNode>(), !bVar1)) {
    __assert_fail("tst_node_cast_helper<BlurNode>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                  ,0x2b,"void tst_node_cast()");
  }
  bVar1 = tst_node_cast_helper<rengine::ShadowNode>();
  if ((!bVar1) && (bVar1 = tst_node_cast_helper<rengine::ShadowNode>(), !bVar1)) {
    __assert_fail("tst_node_cast_helper<ShadowNode>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                  ,0x2c,"void tst_node_cast()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"tst_node_cast");
  poVar2 = std::operator<<(poVar2,": ok");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void tst_node_cast()
{
    check_true(tst_node_cast_helper<OpacityNode>());
    check_true(tst_node_cast_helper<TextureNode>());
    check_true(tst_node_cast_helper<TransformNode>());
    check_true(tst_node_cast_helper<RectangleNode>());
    check_true(tst_node_cast_helper<ColorFilterNode>());
    check_true(tst_node_cast_helper<BlurNode>());
    check_true(tst_node_cast_helper<ShadowNode>());

    cout << __FUNCTION__ << ": ok" << endl;
}